

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  float fVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint *puVar6;
  uint *puVar7;
  ulong uVar8;
  int *piVar9;
  ImGuiDir *pIVar10;
  byte bVar11;
  uint uVar12;
  undefined8 unaff_R15;
  int iVar13;
  int iVar14;
  uint uVar15;
  float fVar16;
  ImVec2 IVar17;
  ImVec2 IVar18;
  ImVec2 IVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar24;
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  
  IVar19 = *ref_pos;
  auVar21._8_8_ = 0;
  auVar21._0_4_ = IVar19.x;
  auVar21._4_4_ = IVar19.y;
  fVar26 = (*size).x;
  fVar28 = (*size).y;
  fVar22 = (r_outer->Min).x;
  fVar24 = (r_outer->Min).y;
  fVar29 = (r_outer->Max).x;
  fVar30 = (r_outer->Max).y;
  if (policy == ImGuiPopupPositionPolicy_ComboBox) {
    iVar2 = *last_dir;
    uVar8 = (ulong)(iVar2 == -1);
    fVar31 = (r_avoid->Max).x - fVar26;
    fVar32 = (r_avoid->Min).y - fVar28;
    fVar1 = (r_avoid->Max).y;
    IVar18.x = (*r_avoid).Min;
    piVar9 = (int *)(&DAT_0025de00 + (ulong)(iVar2 != -1) * -4);
    do {
      pIVar10 = last_dir;
      if (uVar8 != 0) {
        pIVar10 = piVar9;
      }
      iVar3 = *pIVar10;
      if ((uVar8 == 0) || (iVar3 != iVar2)) {
        switch(iVar3) {
        case 0:
          IVar17.y = fVar1;
          IVar17.x = fVar31;
          break;
        case 1:
          IVar17.y = fVar32;
          IVar17.x = IVar18.x;
          break;
        case 2:
          IVar17.y = fVar32;
          IVar17.x = fVar31;
          break;
        case 3:
          IVar18.y = fVar1;
          IVar17 = IVar18;
          break;
        default:
          IVar17.x = 0.0;
          IVar17.y = 0.0;
        }
        fVar16 = IVar17.x;
        iVar13 = -(uint)(fVar26 + fVar16 <= fVar29);
        iVar14 = -(uint)(fVar28 + IVar17.y <= fVar30);
        auVar5._4_4_ = iVar13;
        auVar5._0_4_ = iVar13;
        auVar5._8_4_ = iVar14;
        auVar5._12_4_ = iVar14;
        uVar12 = movmskpd((int)CONCAT71((int7)((ulong)unaff_R15 >> 8),fVar22 <= fVar16),auVar5);
        bVar11 = (byte)((ulong)uVar12 & 0xffffffffffffff02) >> 1 &
                 -(fVar24 <= IVar17.y) & fVar22 <= fVar16 & (byte)uVar12;
        unaff_R15 = CONCAT71((int7)(((ulong)uVar12 & 0xffffffffffffff02) >> 8),bVar11);
        if (bVar11 == 1) {
          *last_dir = iVar3;
          return IVar17;
        }
      }
      uVar8 = uVar8 + 1;
      piVar9 = piVar9 + 1;
    } while (uVar8 != 5);
  }
  if ((policy & ~ImGuiPopupPositionPolicy_Tooltip) == ImGuiPopupPositionPolicy_Default) {
    auVar20._0_4_ = fVar29 - fVar26;
    auVar20._4_4_ = fVar30 - fVar28;
    auVar20._8_8_ = 0;
    auVar21 = minps(auVar20,auVar21);
    uVar12 = -(uint)(IVar19.x < fVar22);
    uVar15 = -(uint)(IVar19.y < fVar24);
    fVar25 = (float)(~uVar12 & auVar21._0_4_ | (uint)fVar22 & uVar12);
    fVar27 = (float)(~uVar15 & auVar21._4_4_ | (uint)fVar24 & uVar15);
    uVar12 = *last_dir;
    uVar8 = (ulong)(uVar12 == 0xffffffff);
    fVar1 = (r_avoid->Min).x;
    fVar31 = (r_avoid->Min).y;
    fVar32 = (r_avoid->Max).x;
    fVar16 = (r_avoid->Max).y;
    puVar7 = (uint *)(&DAT_00261220 + (ulong)(uVar12 != 0xffffffff) * -4);
    do {
      puVar6 = (uint *)last_dir;
      if (uVar8 != 0) {
        puVar6 = puVar7;
      }
      uVar15 = *puVar6;
      if ((uVar8 == 0) || (uVar15 != uVar12)) {
        fVar33 = fVar1;
        if (uVar15 != 0) {
          fVar33 = fVar29;
        }
        fVar34 = fVar32;
        if (uVar15 != 1) {
          fVar34 = fVar22;
        }
        if (fVar26 <= fVar33 - fVar34 || 1 < uVar15) {
          fVar33 = fVar31;
          if (uVar15 != 2) {
            fVar33 = fVar30;
          }
          fVar34 = fVar16;
          if (uVar15 != 3) {
            fVar34 = fVar24;
          }
          if ((fVar28 <= fVar33 - fVar34) || ((uVar15 & 0xfffffffe) != 2)) {
            if (uVar15 == 0) {
              fVar32 = fVar1 - fVar26;
            }
            else if (uVar15 != 1) {
              fVar32 = fVar25;
              if (uVar15 == 2) {
                fVar27 = fVar31 - fVar28;
              }
              else if (uVar15 == 3) {
                fVar27 = fVar16;
              }
            }
            *last_dir = uVar15;
            return (ImVec2)(CONCAT44(~-(uint)(fVar24 <= fVar27) & (uint)fVar24,
                                     ~-(uint)(fVar22 <= fVar32) & (uint)fVar22) |
                           CONCAT44((uint)fVar27 & -(uint)(fVar24 <= fVar27),
                                    (uint)fVar32 & -(uint)(fVar22 <= fVar32)));
          }
        }
      }
      uVar8 = uVar8 + 1;
      puVar7 = puVar7 + 1;
    } while (uVar8 != 5);
  }
  *last_dir = -1;
  if (policy == ImGuiPopupPositionPolicy_Tooltip) {
    IVar19.x = (*ref_pos).x + 2.0;
    IVar19.y = (*ref_pos).y + 2.0;
  }
  else {
    fVar22 = (*size).x;
    auVar23._0_4_ = (*ref_pos).x + fVar22;
    fVar24 = (*size).y;
    auVar23._4_4_ = (*ref_pos).y + fVar24;
    auVar23._8_8_ = 0;
    auVar4._8_8_ = 0;
    auVar4._0_4_ = (r_outer->Max).x;
    auVar4._4_4_ = (r_outer->Max).y;
    auVar21 = minps(auVar23,auVar4);
    fVar22 = auVar21._0_4_ - fVar22;
    fVar24 = auVar21._4_4_ - fVar24;
    fVar26 = (r_outer->Min).x;
    fVar28 = (r_outer->Min).y;
    uVar12 = -(uint)(fVar26 <= fVar22);
    uVar15 = -(uint)(fVar28 <= fVar24);
    IVar19 = (ImVec2)(CONCAT44(~uVar15 & (uint)fVar28,~uVar12 & (uint)fVar26) |
                     CONCAT44((uint)fVar24 & uVar15,(uint)fVar22 & uVar12));
  }
  return IVar19;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GetForegroundDrawList()->AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GetForegroundDrawList()->AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Tooltip and Default popup policy
    // (Always first try the direction we used on the last frame, if any)
    if (policy == ImGuiPopupPositionPolicy_Tooltip || policy == ImGuiPopupPositionPolicy_Default)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;

            const float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
            const float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);

            // If there's not enough room on one axis, there's no point in positioning on a side on this axis (e.g. when not enough width, use a top/bottom position to maximize available width)
            if (avail_w < size.x && (dir == ImGuiDir_Left || dir == ImGuiDir_Right))
                continue;
            if (avail_h < size.y && (dir == ImGuiDir_Up || dir == ImGuiDir_Down))
                continue;

            ImVec2 pos;
            pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
            pos.y = (dir == ImGuiDir_Up) ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down) ? r_avoid.Max.y : base_pos_clamped.y;

            // Clamp top-left corner of popup
            pos.x = ImMax(pos.x, r_outer.Min.x);
            pos.y = ImMax(pos.y, r_outer.Min.y);

            *last_dir = dir;
            return pos;
        }
    }

    // Fallback when not enough room:
    *last_dir = ImGuiDir_None;

    // For tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
    if (policy == ImGuiPopupPositionPolicy_Tooltip)
        return ref_pos + ImVec2(2, 2);

    // Otherwise try to keep within display
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}